

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status
fdb_get_all_snap_markers
          (fdb_file_handle *fhandle,fdb_snapshot_info_t **markers_out,uint64_t *num_markers)

{
  filemgr_header_len_t fVar1;
  fdb_kvs_handle *handle_00;
  bool bVar2;
  uint64_t *datasize_00;
  filemgr_header_revnum_t fVar3;
  filemgr_header_revnum_t *revnum_00;
  err_log_callback *log_callback;
  fdb_seqnum_t *pfVar4;
  uint64_t *puVar5;
  void *pvVar6;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int idx;
  docio_object doc;
  int64_t doc_offset;
  uint64_t num_keeping_headers;
  fdb_status status;
  filemgr_header_revnum_t revnum;
  file_status_t fstatus;
  uint64_t array_size;
  uint64_t size;
  int i;
  fdb_snapshot_info_t *markers;
  fdb_seqnum_t seqnum;
  char *compacted_filename;
  uint64_t version;
  uint64_t header_flags;
  uint64_t kv_info_offset;
  uint64_t last_wal_flush_hdr_bid;
  uint64_t datasize;
  uint64_t nlivenodes;
  uint64_t ndeletes;
  uint64_t ndocs;
  bid_t stale_root_bid;
  bid_t seq_root_bid;
  bid_t trie_root_bid;
  uint8_t header_buf [4096];
  size_t header_len;
  bid_t hdr_bid;
  fdb_kvs_handle *handle;
  undefined8 in_stack_ffffffffffffee48;
  atomic<unsigned_long> *in_stack_ffffffffffffee50;
  docio_object *this;
  fdb_snapshot_info_t *in_stack_ffffffffffffee58;
  fdb_snapshot_info_t *snap_info;
  uint64_t version_00;
  undefined4 in_stack_ffffffffffffee88;
  undefined4 in_stack_ffffffffffffee8c;
  uint64_t *in_stack_ffffffffffffee90;
  filemgr *in_stack_ffffffffffffee98;
  undefined4 in_stack_ffffffffffffeea8;
  int in_stack_ffffffffffffeeac;
  uint64_t *in_stack_ffffffffffffeeb0;
  uint64_t *in_stack_ffffffffffffeeb8;
  char **in_stack_ffffffffffffeec0;
  char **in_stack_ffffffffffffeec8;
  size_t *in_stack_ffffffffffffeed0;
  void *in_stack_ffffffffffffeed8;
  uint64_t in_stack_ffffffffffffeee0;
  filemgr *in_stack_ffffffffffffeee8;
  undefined4 in_stack_ffffffffffffeef8;
  uint64_t *local_1100;
  file_status_t local_10f1;
  fdb_seqnum_t *seqnum_00;
  undefined4 in_stack_ffffffffffffef20;
  int iVar7;
  fdb_seqnum_t bid;
  filemgr *in_stack_ffffffffffffef38;
  filemgr_magic_t local_10c0;
  bid_t local_10b8;
  undefined7 local_10b0;
  undefined1 in_stack_ffffffffffffef57;
  docio_object *in_stack_ffffffffffffef58;
  uint64_t *in_stack_ffffffffffffef60;
  docio_handle *in_stack_ffffffffffffef68;
  fdb_kvs_commit_marker_t *in_stack_ffffffffffffef70;
  err_log_callback *in_stack_ffffffffffffef78;
  fdb_log_callback local_60;
  fdb_status local_34;
  
  local_34 = FDB_RESULT_SUCCESS;
  if (in_RDI == (undefined8 *)0x0) {
    local_34 = FDB_RESULT_INVALID_HANDLE;
  }
  else if ((in_RSI == (undefined8 *)0x0) || (in_RDX == (undefined8 *)0x0)) {
    local_34 = FDB_RESULT_INVALID_ARGS;
  }
  else {
    handle_00 = (fdb_kvs_handle *)*in_RDI;
    if (handle_00->file == (filemgr *)0x0) {
      local_34 = FDB_RESULT_FILE_NOT_OPEN;
    }
    else {
      fdb_check_file_reopen(handle_00,&local_10f1);
      fdb_sync_db_header((fdb_kvs_handle *)CONCAT44(local_34,in_stack_ffffffffffffeef8));
      datasize_00 = (uint64_t *)
                    std::__atomic_base::operator_cast_to_unsigned_long
                              ((__atomic_base<unsigned_long> *)in_stack_ffffffffffffee58);
      fVar3 = sb_get_min_live_revnum(handle_00->file);
      revnum_00 = (filemgr_header_revnum_t *)((long)datasize_00 - fVar3);
      if (revnum_00 == (filemgr_header_revnum_t *)0x0) {
        local_34 = FDB_RESULT_NO_DB_INSTANCE;
      }
      else {
        log_callback = (err_log_callback *)calloc((size_t)revnum_00,0x18);
        if (log_callback == (err_log_callback *)0x0) {
          local_34 = FDB_RESULT_ALLOC_FAIL;
        }
        else {
          bid = handle_00->seqnum;
          local_60 = (fdb_log_callback)
                     std::__atomic_base::operator_cast_to_unsigned_long
                               ((__atomic_base<unsigned_long> *)in_stack_ffffffffffffee58);
          fVar1 = (handle_00->file->header).size;
          seqnum_00 = (fdb_seqnum_t *)0x0;
          pfVar4 = (fdb_seqnum_t *)
                   atomic_get_uint64_t(in_stack_ffffffffffffee50,
                                       (memory_order)((ulong)in_stack_ffffffffffffee48 >> 0x20));
          iVar7 = 0;
          for (; (fVar1 != 0 &&
                 ((((handle_00->config).block_reusing_threshold == 0 ||
                   (99 < (handle_00->config).block_reusing_threshold)) || (seqnum_00 < pfVar4))));
              seqnum_00 = (fdb_seqnum_t *)((long)seqnum_00 + 1)) {
            if (iVar7 == 0) {
              in_stack_ffffffffffffee98 = handle_00->file;
              std::__atomic_base::operator_cast_to_unsigned_long
                        ((__atomic_base<unsigned_long> *)in_stack_ffffffffffffee58);
              local_34 = filemgr_fetch_header
                                   (in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee0,
                                    in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,
                                    (fdb_seqnum_t *)in_stack_ffffffffffffeec8,
                                    (filemgr_header_revnum_t *)in_stack_ffffffffffffeec0,revnum_00,
                                    seqnum_00,(uint64_t *)CONCAT44(iVar7,in_stack_ffffffffffffef20),
                                    log_callback);
            }
            else {
              if (revnum_00 <= (filemgr_header_revnum_t *)(long)iVar7) break;
              local_60 = (fdb_log_callback)
                         filemgr_fetch_prev_header
                                   (in_stack_ffffffffffffef38,bid,log_callback,
                                    (size_t *)CONCAT44(iVar7,in_stack_ffffffffffffef20),seqnum_00,
                                    revnum_00,in_stack_ffffffffffffef60,
                                    (uint64_t *)in_stack_ffffffffffffef68,
                                    (uint64_t *)in_stack_ffffffffffffef70,in_stack_ffffffffffffef78)
              ;
            }
            if ((fVar1 == 0) ||
               ((bVar2 = ver_superblock_support(local_10c0), bVar2 &&
                (in_stack_ffffffffffffee90 = local_1100,
                puVar5 = (uint64_t *)sb_get_min_live_revnum(handle_00->file),
                in_stack_ffffffffffffee90 < puVar5)))) break;
            this = (docio_object *)&stack0xffffffffffffef68;
            in_stack_ffffffffffffee58 = (fdb_snapshot_info_t *)&stack0xffffffffffffef60;
            snap_info = (fdb_snapshot_info_t *)&stack0xffffffffffffef38;
            version_00 = 0;
            fdb_fetch_header(0,snap_info,&local_10b8,(bid_t *)&local_10b0,
                             (bid_t *)&stack0xffffffffffffef58,(uint64_t *)in_stack_ffffffffffffee58
                             ,in_stack_ffffffffffffee90,(uint64_t *)in_stack_ffffffffffffee98,
                             datasize_00,
                             (uint64_t *)
                             CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8),
                             in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeb8,
                             in_stack_ffffffffffffeec0,in_stack_ffffffffffffeec8);
            log_callback[iVar7].callback = local_60;
            if (CONCAT17(in_stack_ffffffffffffef57,local_10b0) == -1) {
              log_callback[iVar7].callback_ex = (fdb_log_callback_ex)0x1;
              pvVar6 = malloc(0x10);
              log_callback[iVar7].ctx_data = pvVar6;
              if (log_callback[iVar7].ctx_data == (void *)0x0) {
                fdb_free_snap_markers(in_stack_ffffffffffffee58,(uint64_t)this);
                return FDB_RESULT_ALLOC_FAIL;
              }
              *(fdb_seqnum_t *)((long)log_callback[iVar7].ctx_data + 8) = bid;
              *(undefined8 *)log_callback[iVar7].ctx_data = 0;
            }
            else {
              docio_object::docio_object(this);
              memset(&stack0xffffffffffffeeb0,0,0x38);
              in_stack_ffffffffffffeee8 =
                   (filemgr *)
                   docio_read_doc(in_stack_ffffffffffffef68,(uint64_t)in_stack_ffffffffffffef60,
                                  in_stack_ffffffffffffef58,(bool)in_stack_ffffffffffffef57);
              if ((long)in_stack_ffffffffffffeee8 < 1) {
                fdb_free_snap_markers(in_stack_ffffffffffffee58,(uint64_t)this);
                if ((long)in_stack_ffffffffffffeee8 < 0) {
                  return (fdb_status)in_stack_ffffffffffffeee8;
                }
                return FDB_RESULT_READ_FAIL;
              }
              local_34 = _fdb_kvs_get_snap_info
                                   ((void *)CONCAT44(in_stack_ffffffffffffee8c,
                                                     in_stack_ffffffffffffee88),version_00,snap_info
                                   );
              if (local_34 != FDB_RESULT_SUCCESS) {
                fdb_free_snap_markers(in_stack_ffffffffffffee58,(uint64_t)this);
                return local_34;
              }
              in_stack_ffffffffffffeeac = (int)log_callback[iVar7].callback_ex + -1;
              *(fdb_seqnum_t *)
               ((long)log_callback[iVar7].ctx_data + (long)in_stack_ffffffffffffeeac * 0x10 + 8) =
                   bid;
              *(undefined8 *)
               ((long)log_callback[iVar7].ctx_data + (long)in_stack_ffffffffffffeeac * 0x10) = 0;
              free_docio_object(this,(uint8_t)((ulong)&stack0xffffffffffffef70 >> 0x38),
                                (uint8_t)((ulong)&stack0xffffffffffffef70 >> 0x30),
                                (uint8_t)((ulong)&stack0xffffffffffffef70 >> 0x28));
            }
            iVar7 = iVar7 + 1;
          }
          *in_RSI = log_callback;
          *in_RDX = seqnum_00;
        }
      }
    }
  }
  return local_34;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_all_snap_markers(fdb_file_handle *fhandle,
                                    fdb_snapshot_info_t **markers_out,
                                    uint64_t *num_markers)
{
    fdb_kvs_handle *handle;
    bid_t hdr_bid;
    size_t header_len;
    uint8_t header_buf[FDB_BLOCKSIZE];
    bid_t trie_root_bid = BLK_NOT_FOUND;
    bid_t seq_root_bid = BLK_NOT_FOUND;
    bid_t stale_root_bid = BLK_NOT_FOUND;
    uint64_t ndocs;
    uint64_t ndeletes;
    uint64_t nlivenodes;
    uint64_t datasize;
    uint64_t last_wal_flush_hdr_bid;
    uint64_t kv_info_offset;
    uint64_t header_flags;
    uint64_t version;
    char *compacted_filename;
    fdb_seqnum_t seqnum;
    fdb_snapshot_info_t *markers;
    int i;
    uint64_t size, array_size;
    file_status_t fstatus;
    filemgr_header_revnum_t revnum;
    fdb_status status = FDB_RESULT_SUCCESS;

    if (!fhandle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!markers_out || !num_markers) {
        return FDB_RESULT_INVALID_ARGS;
    }

    handle = fhandle->root;
    if (!handle->file) {
        return FDB_RESULT_FILE_NOT_OPEN;
    }

    fdb_check_file_reopen(handle, &fstatus);
    fdb_sync_db_header(handle);

    // There are as many DB headers in a file as the file's header revision num
    array_size = handle->cur_header_revnum - sb_get_min_live_revnum(handle->file);
    if (!array_size) {
        return FDB_RESULT_NO_DB_INSTANCE;
    }
    markers = (fdb_snapshot_info_t *)calloc(array_size, sizeof(fdb_snapshot_info_t));
    if (!markers) { // LCOV_EXCL_START
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP

    // Start loading from current header
    seqnum = handle->seqnum;
    hdr_bid = handle->last_hdr_bid;
    header_len = handle->file->header.size;
    size = 0;

    uint64_t num_keeping_headers =
        atomic_get_uint64_t(&handle->file->config->num_keeping_headers,
                            std::memory_order_relaxed);

    // Reverse scan the file to locate the DB header with seqnum marker
    for (i = 0; header_len; ++i, ++size) {
        if (handle->config.block_reusing_threshold > 0 &&
            handle->config.block_reusing_threshold < 100 &&
            size >= num_keeping_headers) {
            // if block reuse is enabled,
            // do not allow to scan beyond the config parameter
            break;
        }

        if (i == 0) {
            status = filemgr_fetch_header(handle->file, handle->last_hdr_bid,
                                          header_buf, &header_len, &seqnum,
                                          &revnum, NULL, &version, NULL,
                                          &handle->log_callback);
        } else {
            if ((uint64_t)i >= array_size) {
                break;
            }
            hdr_bid = filemgr_fetch_prev_header(handle->file, hdr_bid,
                                                header_buf, &header_len,
                                                &seqnum, &revnum, NULL, &version,
                                                NULL, &handle->log_callback);
        }
        if (header_len == 0) {
            break; // header doesn't exist, terminate iteration
        }
        if (ver_superblock_support(version) &&
            revnum < sb_get_min_live_revnum(handle->file)) {
            break; // eariler than the last block reclaiming
        }

        fdb_fetch_header(version, header_buf,
                         &trie_root_bid, &seq_root_bid, &stale_root_bid,
                         &ndocs, &ndeletes, &nlivenodes, &datasize,
                         &last_wal_flush_hdr_bid, &kv_info_offset,
                         &header_flags, &compacted_filename, NULL);

        markers[i].marker = (fdb_snapshot_marker_t)hdr_bid;
        if (kv_info_offset == BLK_NOT_FOUND) { // Single kv instance mode
            markers[i].num_kvs_markers = 1;
            markers[i].kvs_markers = (fdb_kvs_commit_marker_t *)malloc(
                                            sizeof(fdb_kvs_commit_marker_t));
            if (!markers[i].kvs_markers) { // LCOV_EXCL_START
                fdb_free_snap_markers(markers, i);
                return FDB_RESULT_ALLOC_FAIL;
            } // LCOV_EXCL_STOP
            markers[i].kvs_markers->seqnum = seqnum;
            markers[i].kvs_markers->kv_store_name = NULL;
        } else { // Multi kv instance mode
            int64_t doc_offset;
            struct docio_object doc;
            memset(&doc, 0, sizeof(struct docio_object));
            doc_offset = docio_read_doc(handle->dhandle, kv_info_offset, &doc,
                                        true);
            if (doc_offset <= 0) {
                fdb_free_snap_markers(markers, i);
                return doc_offset < 0 ? (fdb_status) doc_offset : FDB_RESULT_READ_FAIL;
            }
            status = _fdb_kvs_get_snap_info(doc.body, version,
                                            &markers[i]);
            if (status != FDB_RESULT_SUCCESS) { // LCOV_EXCL_START
                fdb_free_snap_markers(markers, i);
                return status;
            } // LCOV_EXCL_STOP

            int idx = markers[i].num_kvs_markers - 1;
            markers[i].kvs_markers[idx].seqnum = seqnum;
            markers[i].kvs_markers[idx].kv_store_name = NULL;

            free_docio_object(&doc, 1, 1, 1);
        }
    }

    *markers_out = markers;
    *num_markers = size;

    return status;
}